

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::RandCaseStatementSyntax::RandCaseStatementSyntax
          (RandCaseStatementSyntax *this,NamedLabelSyntax *label,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token randCase,
          SyntaxList<slang::syntax::RandCaseItemSyntax> *items,Token endCase)

{
  Token TVar1;
  iterator ppRVar2;
  undefined8 uVar3;
  RandCaseItemSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::RandCaseItemSyntax> *__range2;
  SyntaxList<slang::syntax::RandCaseItemSyntax> *items_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  NamedLabelSyntax *label_local;
  RandCaseStatementSyntax *this_local;
  Token randCase_local;
  
  TVar1 = endCase;
  uVar3 = randCase._0_8_;
  StatementSyntax::StatementSyntax(&this->super_StatementSyntax,RandCaseStatement,label,attributes);
  (this->randCase).kind = (short)uVar3;
  (this->randCase).field_0x2 = (char)((ulong)uVar3 >> 0x10);
  (this->randCase).numFlags = (NumericTokenFlags)(char)((ulong)uVar3 >> 0x18);
  (this->randCase).rawLen = (int)((ulong)uVar3 >> 0x20);
  (this->randCase).info = randCase.info;
  SyntaxList<slang::syntax::RandCaseItemSyntax>::SyntaxList(&this->items,items);
  (this->endCase).kind = endCase.kind;
  (this->endCase).field_0x2 = endCase._2_1_;
  (this->endCase).numFlags = (NumericTokenFlags)endCase.numFlags.raw;
  (this->endCase).rawLen = endCase.rawLen;
  endCase.info = TVar1.info;
  (this->endCase).info = endCase.info;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>::
           begin(&(this->items).
                  super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>);
  ppRVar2 = nonstd::span_lite::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>::
            end(&(this->items).
                 super_span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>);
  for (; __end2 != ppRVar2; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

RandCaseStatementSyntax(NamedLabelSyntax* label, const SyntaxList<AttributeInstanceSyntax>& attributes, Token randCase, const SyntaxList<RandCaseItemSyntax>& items, Token endCase) :
        StatementSyntax(SyntaxKind::RandCaseStatement, label, attributes), randCase(randCase), items(items), endCase(endCase) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }